

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_pool_2d_back(ggml_compute_params *params,ggml_tensor *dst)

{
  short *psVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ggml_tensor *pgVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  size_t __n;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  int ky;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  undefined8 uVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  ulong uVar30;
  int iVar31;
  void *__s;
  float *pfVar32;
  ulong uVar33;
  bool bVar34;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar36 [16];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [64];
  void *local_b0;
  void *local_88;
  undefined8 uVar35;
  undefined1 auVar37 [12];
  
  if (params->ith == 0) {
    uVar4 = dst->op_params[2];
    iVar5 = dst->op_params[3];
    iVar6 = dst->op_params[0];
    pgVar11 = dst->src[0];
    uVar7 = dst->op_params[1];
    iVar8 = dst->op_params[4];
    __s = dst->data;
    iVar9 = dst->op_params[5];
    iVar10 = dst->op_params[6];
    local_88 = dst->src[1]->data;
    lVar15 = ggml_nbytes(dst);
    if (params->ith != 0) {
      pcVar19 = "params->ith == 0";
      uVar26 = 0x190c;
      uVar35 = extraout_XMM0_Qa;
      uVar38 = extraout_XMM1_Qa;
LAB_0013f5be:
      ggml_abort(uVar35,uVar38,
                 "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,uVar26,"GGML_ASSERT(%s) failed",pcVar19);
    }
    pvVar16 = (void *)(lVar15 + (long)__s);
    __n = ggml_nbytes(dst);
    auVar41._8_56_ = extraout_var;
    auVar41._0_8_ = extraout_XMM0_Qa_00;
    auVar37 = auVar41._4_12_;
    memset(__s,0,__n);
    uVar12 = pgVar11->ne[1];
    uVar13 = pgVar11->ne[0];
    local_b0 = pgVar11->data;
    uVar38 = 0;
    uVar27 = (ulong)(~((int)uVar7 >> 0x1f) & uVar7);
    uVar28 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
    auVar36._0_4_ = (float)(int)(uVar4 * uVar7);
    auVar36._4_12_ = auVar37;
    uVar35 = auVar36._0_8_;
    for (; __s < pvVar16; __s = (void *)((long)__s + dst->nb[2])) {
      iVar14 = -iVar10;
      for (uVar18 = 0; uVar18 != (~((long)uVar12 >> 0x3f) & uVar12); uVar18 = uVar18 + 1) {
        iVar17 = iVar8 * (int)uVar18 - iVar10;
        iVar31 = -iVar9;
        for (uVar22 = 0; uVar22 != (~((long)uVar13 >> 0x3f) & uVar13); uVar22 = uVar22 + 1) {
          lVar15 = (long)iVar31;
          fVar2 = *(float *)((long)local_b0 + uVar22 * 4 + uVar13 * uVar18 * 4);
          if (iVar6 == 1) {
            uVar24 = 0;
            auVar39._4_12_ = ZEXT812(0) << 0x20;
            auVar39._0_4_ = fVar2 / auVar36._0_4_;
            auVar39 = vcvtps2ph_f16c(auVar39,0);
            lVar23 = (long)iVar14;
            for (; uVar24 != uVar28; uVar24 = uVar24 + 1) {
              lVar20 = uVar24 + (long)iVar17;
              if ((-1 < lVar20) && (lVar20 < dst->ne[1])) {
                lVar25 = dst->nb[1] * lVar23;
                lVar20 = lVar15;
                uVar30 = uVar27;
                while (bVar34 = uVar30 != 0, uVar30 = uVar30 - 1, bVar34) {
                  if ((-1 < lVar20) && (lVar20 < dst->ne[0])) {
                    if (dst->type == GGML_TYPE_F32) {
                      *(float *)((long)__s + lVar20 * 4 + lVar25) =
                           fVar2 / auVar36._0_4_ + *(float *)((long)__s + lVar20 * 4 + lVar25);
                    }
                    else {
                      psVar1 = (short *)((long)__s + lVar20 * 2 + lVar25);
                      *psVar1 = *psVar1 + auVar39._0_2_;
                    }
                  }
                  lVar20 = lVar20 + 1;
                }
              }
              lVar23 = lVar23 + 1;
            }
          }
          else {
            if (iVar6 != 0) {
              pcVar19 = "false";
              uVar26 = 0x195f;
              goto LAB_0013f5be;
            }
            uVar24 = 0xffffffffffffffff;
            uVar30 = 0xffffffff;
            auVar41 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
            lVar23 = (long)iVar14;
            for (uVar33 = 0; uVar33 != uVar28; uVar33 = uVar33 + 1) {
              lVar20 = uVar33 + (long)iVar17;
              if ((-1 < lVar20) && (lVar20 < dst->ne[1])) {
                lVar20 = dst->nb[1] * lVar23;
                pfVar29 = (float *)((long)local_88 + lVar20 + lVar15 * 4);
                for (uVar21 = 0; uVar27 != uVar21; uVar21 = uVar21 + 1) {
                  if ((-1 < (long)(lVar15 + uVar21)) && ((long)(lVar15 + uVar21) < dst->ne[0])) {
                    pfVar32 = pfVar29;
                    if (dst->type != GGML_TYPE_F32) {
                      pfVar32 = (float *)(&ggml_table_f32_f16 +
                                         (ulong)*(ushort *)
                                                 ((long)local_88 + uVar21 * 2 + lVar20 + lVar15 * 2)
                                         * 4);
                    }
                    fVar3 = *pfVar32;
                    fVar40 = auVar41._0_4_;
                    uVar26 = vcmpss_avx512f(ZEXT416((uint)fVar3),auVar41._0_16_,6);
                    bVar34 = (bool)((byte)uVar26 & 1);
                    auVar41 = ZEXT1664(CONCAT124(auVar41._4_12_,
                                                 (uint)bVar34 * (int)fVar3 +
                                                 (uint)!bVar34 * (int)fVar40));
                    if (fVar40 < fVar3) {
                      uVar30 = uVar33 & 0xffffffff;
                    }
                    uVar24 = uVar24 & 0xffffffff;
                    if (fVar40 < fVar3) {
                      uVar24 = uVar21 & 0xffffffff;
                    }
                  }
                  pfVar29 = pfVar29 + 1;
                }
              }
              lVar23 = lVar23 + 1;
            }
            if (((int)uVar24 != -1) && ((int)uVar30 != -1)) {
              lVar15 = (long)((int)uVar30 + iVar17) * dst->nb[1];
              lVar23 = (long)((int)uVar24 + (iVar5 * (int)uVar22 - iVar9));
              if (dst->type == GGML_TYPE_F32) {
                *(float *)((long)__s + lVar23 * 4 + lVar15) =
                     fVar2 + *(float *)((long)__s + lVar23 * 4 + lVar15);
              }
              else {
                auVar39 = vcvtps2ph_f16c(ZEXT416((uint)(fVar2 + *(float *)(&ggml_table_f32_f16 +
                                                                          (ulong)*(ushort *)
                                                                                  ((long)__s +
                                                                                  lVar23 * 2 +
                                                                                  lVar15) * 4))),0);
                vpextrw_avx(auVar39,0);
              }
            }
          }
          iVar31 = iVar31 + iVar5;
        }
        iVar14 = iVar14 + iVar8;
      }
      local_88 = (void *)((long)local_88 + dst->nb[2]);
      local_b0 = (void *)((long)local_b0 + uVar12 * uVar13 * 4);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src  = dst->src[0];
    const ggml_tensor * dstf = dst->src[1]; // forward tensor of dst

    assert(dst->type == GGML_TYPE_F32 || dst->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];

    char       * cdata  = (char       *) dst->data;
    const char * cdataf = (const char *) dstf->data;
    const char * const data_end = cdata + ggml_nbytes(dst);

    GGML_ASSERT(params->ith == 0);
    memset(cdata, 0, ggml_nbytes(dst));

    const int64_t px = src->ne[0];
    const int64_t py = src->ne[1];
    const int64_t pa = px * py;

    const float * splane = (const float *) src->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            const float * const srow = splane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                const float grad0 = srow[ox];

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                if (op == GGML_OP_POOL_MAX) {
                    float maxval = -FLT_MAX;
                    int kxmax = -1;
                    int kymax = -1;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        const void * drowf = (const void *)(cdataf + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            const float val = dst->type == GGML_TYPE_F32 ?
                                ((const float *) drowf)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t *) drowf)[j]);
                            if (val <= maxval) {
                                continue;
                            }

                            maxval = val;
                            kxmax = kx;
                            kymax = ky;
                        }
                    }

                    if (kxmax == -1 || kymax == -1) {
                        continue;
                    }

                    void * drow = (void *)(cdata + dst->nb[1] * (iy + kymax));
                    const int j = ix + kxmax;
                    if (dst->type == GGML_TYPE_F32) {
                        ((float *) drow)[j] += grad0;
                    } else {
                        ((ggml_fp16_t *) drow)[j] = GGML_FP32_TO_FP16(grad0 + GGML_FP16_TO_FP32(((const ggml_fp16_t *) drow)[j]));
                    }
                } else if (op == GGML_OP_POOL_AVG) {
                    const float grad = grad0 / ka;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        void * drow = (void *)(cdata + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            if (dst->type == GGML_TYPE_F32) {
                                ((float *) drow)[j] += grad;
                            } else {
                                ((ggml_fp16_t *) drow)[j] += GGML_FP32_TO_FP16(grad);
                            }
                        }
                    }
                } else {
                    GGML_ASSERT(false);
                }
            }
        }

        cdata  += dst->nb[2];
        cdataf += dst->nb[2];
        splane += pa;
    }
}